

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::PrivkeyHexData::PrivkeyHexData(PrivkeyHexData *this)

{
  allocator local_25 [20];
  allocator local_11;
  PrivkeyHexData *local_10;
  PrivkeyHexData *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::PrivkeyHexData>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::PrivkeyHexData>);
  (this->super_JsonClassBase<cfd::js::api::json::PrivkeyHexData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PrivkeyHexData_01b3eec8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->network_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->is_compressed_ = true;
  CollectFieldName();
  return;
}

Assistant:

PrivkeyHexData() {
    CollectFieldName();
  }